

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O2

unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
 __thiscall
Diligent::FramebufferCache::CreateDyanmicRenderInfo
          (FramebufferCache *this,FramebufferCacheKey *Key,CreateDyanmicRenderInfoAttribs *Attribs)

{
  bool bVar1;
  RenderDeviceVkImpl *pRVar2;
  VkExtent2D VVar3;
  VkRenderingAttachmentInfoKHR *pVVar4;
  VkRenderingFragmentShadingRateAttachmentInfoKHR *pVVar5;
  Uint32 rt;
  ulong uVar6;
  size_t local_38;
  
  local_38 = FramebufferCacheKey::GetHash(Key);
  std::
  make_unique<VulkanUtilities::RenderingInfoWrapper,unsigned_long,unsigned_int_const&,bool_const&,bool_const&>
            ((unsigned_long *)this,(uint *)&local_38,(bool *)&Key->NumRenderTargets,
             &Attribs->UseDepthAttachment);
  pRVar2 = this->m_DeviceVk;
  VVar3 = Attribs->Extent;
  *(undefined8 *)
   ((long)&(pRVar2->
           super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_pEngineFactory.m_pObject + 4) =
       0;
  *(VkExtent2D *)
   &(pRVar2->
    super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
    ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.field_0x1c = VVar3;
  *(undefined8 *)
   ((pRVar2->
    super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
    ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.Description + 4) =
       *(undefined8 *)&Attribs->Layers;
  for (uVar6 = 0; uVar6 < Key->NumRenderTargets; uVar6 = uVar6 + 1) {
    pVVar4 = VulkanUtilities::RenderingInfoWrapper::GetColorAttachment
                       ((RenderingInfoWrapper *)this->m_DeviceVk,(uint32_t)uVar6);
    pVVar4->imageView = Key->RTVs[uVar6];
    pVVar4->imageLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
    *(undefined8 *)&pVVar4->resolveMode = 0;
    *(undefined8 *)((long)&pVVar4->resolveImageView + 4) = 0;
    pVVar4->loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    pVVar4->storeOp = VK_ATTACHMENT_STORE_OP_STORE;
    *(float *)&pVVar4->clearValue = 0.0;
    *(uint32_t *)((long)&pVVar4->clearValue + 4) = 0;
    *(undefined8 *)((long)&pVVar4->clearValue + 8) = 0;
  }
  if (Attribs->UseDepthAttachment != false) {
    pVVar4 = VulkanUtilities::RenderingInfoWrapper::GetDepthAttachment
                       ((RenderingInfoWrapper *)this->m_DeviceVk);
    bVar1 = Attribs->ReadOnlyDepthStencil;
    pVVar4->imageView = Key->DSV;
    pVVar4->imageLayout = bVar1 + VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
    *(undefined8 *)&pVVar4->resolveMode = 0;
    *(undefined8 *)((long)&pVVar4->resolveImageView + 4) = 0;
    pVVar4->loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    pVVar4->storeOp = VK_ATTACHMENT_STORE_OP_STORE;
    *(float *)&pVVar4->clearValue = 0.0;
    *(uint32_t *)((long)&pVVar4->clearValue + 4) = 0;
    *(undefined8 *)((long)&pVVar4->clearValue + 8) = 0;
  }
  if (Attribs->UseStencilAttachment == true) {
    pVVar4 = VulkanUtilities::RenderingInfoWrapper::GetStencilAttachment
                       ((RenderingInfoWrapper *)this->m_DeviceVk);
    bVar1 = Attribs->ReadOnlyDepthStencil;
    pVVar4->imageView = Key->DSV;
    pVVar4->imageLayout = bVar1 + VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
    *(undefined8 *)&pVVar4->resolveMode = 0;
    *(undefined8 *)((long)&pVVar4->resolveImageView + 4) = 0;
    pVVar4->loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    pVVar4->storeOp = VK_ATTACHMENT_STORE_OP_STORE;
    *(float *)&pVVar4->clearValue = 0.0;
    *(uint32_t *)((long)&pVVar4->clearValue + 4) = 0;
    *(undefined8 *)((long)&pVVar4->clearValue + 8) = 0;
  }
  if (Key->ShadingRate != (VkImageView)0x0) {
    pVVar5 = VulkanUtilities::RenderingInfoWrapper::GetShadingRateAttachment
                       ((RenderingInfoWrapper *)this->m_DeviceVk);
    pVVar5->imageView = Key->ShadingRate;
    pVVar5->imageLayout = VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR;
    pVVar5->shadingRateAttachmentTexelSize = Attribs->ShadingRateTexelSize;
  }
  return (__uniq_ptr_data<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>,_true,_true>
          )(__uniq_ptr_data<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<VulkanUtilities::RenderingInfoWrapper> FramebufferCache::CreateDyanmicRenderInfo(const FramebufferCacheKey&            Key,
                                                                                                 const CreateDyanmicRenderInfoAttribs& Attribs)
{
    std::unique_ptr<VulkanUtilities::RenderingInfoWrapper> RI = std::make_unique<VulkanUtilities::RenderingInfoWrapper>(
        Key.GetHash(), Key.NumRenderTargets, Attribs.UseDepthAttachment, Attribs.UseStencilAttachment);

    RI->SetRenderArea({{0, 0}, Attribs.Extent})
        .SetLayerCount(Attribs.Layers)
        .SetViewMask(Attribs.ViewMask);

    auto InitAttachment = [](VkRenderingAttachmentInfoKHR& Attachment, VkImageView View, VkImageLayout Layout) {
        Attachment.imageView          = View;
        Attachment.imageLayout        = Layout;
        Attachment.resolveMode        = VK_RESOLVE_MODE_NONE_KHR;
        Attachment.resolveImageView   = VK_NULL_HANDLE;
        Attachment.resolveImageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
        Attachment.loadOp             = VK_ATTACHMENT_LOAD_OP_LOAD;
        Attachment.storeOp            = VK_ATTACHMENT_STORE_OP_STORE;
        Attachment.clearValue         = VkClearValue{};
    };

    for (Uint32 rt = 0; rt < Key.NumRenderTargets; ++rt)
    {
        VkRenderingAttachmentInfoKHR& RTAttachment = RI->GetColorAttachment(rt);
        InitAttachment(RTAttachment, Key.RTVs[rt], VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);
    }

    if (Attribs.UseDepthAttachment)
    {
        VkRenderingAttachmentInfoKHR& DepthAttachment = RI->GetDepthAttachment();
        InitAttachment(DepthAttachment, Key.DSV, Attribs.ReadOnlyDepthStencil ? VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL : VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
    }

    if (Attribs.UseStencilAttachment)
    {
        VkRenderingAttachmentInfoKHR& StencilAttachment = RI->GetStencilAttachment();
        InitAttachment(StencilAttachment, Key.DSV, Attribs.ReadOnlyDepthStencil ? VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL : VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
    }

    if (Key.ShadingRate)
    {
        VkRenderingFragmentShadingRateAttachmentInfoKHR& ShadingRateAttachment = RI->GetShadingRateAttachment();

        ShadingRateAttachment.imageView                      = Key.ShadingRate;
        ShadingRateAttachment.imageLayout                    = VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR;
        ShadingRateAttachment.shadingRateAttachmentTexelSize = Attribs.ShadingRateTexelSize;
    }

    return RI;
}